

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audioview.cpp
# Opt level: O0

void __thiscall FSSAudioView::setAudioData(FSSAudioView *this,PBuffer *data,QString *format)

{
  bool bVar1;
  uint uVar2;
  QTemporaryFile *pQVar3;
  element_type *peVar4;
  void *pvVar5;
  size_t sVar6;
  int __oflag;
  QString *__file;
  QMessageLogger local_d0;
  QDebug local_b0;
  size_t local_a8;
  qint64 size;
  QDebug local_80;
  undefined1 local_75;
  QString local_68;
  QString local_50;
  QString local_38;
  QString *local_20;
  QString *format_local;
  PBuffer *data_local;
  FSSAudioView *this_local;
  
  local_20 = format;
  format_local = (QString *)data;
  data_local = (PBuffer *)this;
  if (this->file != (QTemporaryFile *)0x0) {
    if (this->file != (QTemporaryFile *)0x0) {
      (**(code **)(*(long *)this->file + 0x20))();
    }
    this->file = (QTemporaryFile *)0x0;
  }
  QWidget::setEnabled(SUB81(this->buttonPlay,0));
  QWidget::setEnabled(SUB81(this->slider,0));
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)data);
  if (bVar1) {
    pQVar3 = (QTemporaryFile *)operator_new(0x10);
    local_75 = 1;
    QDir::tempPath();
    operator+(&local_50,&local_68,"/XXXXXX.");
    operator+(&local_38,&local_50,local_20);
    __file = &local_38;
    QTemporaryFile::QTemporaryFile(pQVar3,__file);
    local_75 = 0;
    this->file = pQVar3;
    QString::~QString(&local_38);
    QString::~QString(&local_50);
    QString::~QString(&local_68);
    uVar2 = QTemporaryFile::open(this->file,(char *)__file,__oflag);
    if ((uVar2 & 1) == 0) {
      QMessageLogger::QMessageLogger((QMessageLogger *)&size,(char *)0x0,0,(char *)0x0);
      QMessageLogger::debug();
      QDebug::operator<<(&local_80,"Failed to open temporary file");
      QDebug::~QDebug(&local_80);
    }
    else {
      peVar4 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          data);
      local_a8 = Buffer::get_size(peVar4);
      pQVar3 = this->file;
      peVar4 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          data);
      pvVar5 = Buffer::get_data(peVar4);
      sVar6 = QIODevice::write((char *)pQVar3,(longlong)pvVar5);
      if (sVar6 == local_a8) {
        (**(code **)(*(long *)this->file + 0x70))();
      }
      else {
        QMessageLogger::QMessageLogger(&local_d0,(char *)0x0,0,(char *)0x0);
        QMessageLogger::debug();
        QDebug::operator<<(&local_b0,"Failed to write to temporary file");
        QDebug::~QDebug(&local_b0);
      }
    }
  }
  return;
}

Assistant:

void
FSSAudioView::setAudioData(PBuffer data, const QString &format) {
  if (file != nullptr) {
    delete file;
    file = nullptr;
  }
  buttonPlay->setEnabled(false);
  slider->setEnabled(false);

  if (!data) {
    return;
  }

  file = new QTemporaryFile(QDir::tempPath() + "/XXXXXX." + format);
  if (!file->open()) {
    qDebug() << "Failed to open temporary file";
    return;
  }
  qint64 size = data->get_size();
  if (file->write((const char*)data->get_data(), size) != size) {
    qDebug() << "Failed to write to temporary file";
    return;
  }
  file->close();
}